

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

bool __thiscall
cmComputeTargetDepends::ComputeFinalDepends
          (cmComputeTargetDepends *this,cmComputeComponentGraph *ccg)

{
  int iVar1;
  value_type vVar2;
  bool bVar3;
  vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_> *this_00;
  vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_> *this_01;
  size_type sVar4;
  vector<int,_std::allocator<int>_> *cmap_00;
  reference piVar5;
  reference pvVar6;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *this_02;
  vector<cmGraphEdge,std::allocator<cmGraphEdge>> *this_03;
  cmListFileBacktrace *__args_2;
  bool local_131;
  value_type local_130;
  int local_12c;
  int dependee_component_head;
  int dependee_component;
  cmGraphEdge *ni_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  EdgeList *__range2_1;
  EdgeList *nl_1;
  int depender_component_tail;
  int depender_component;
  int n;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  undefined1 local_b8 [4];
  int ni;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  __end2;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  __begin2;
  cmGraphNodeList local_98;
  cmRange<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
  *__range2;
  NodeList *nl;
  set<int,_std::less<int>,_std::allocator<int>_> emitted;
  int local_40;
  int head;
  int c;
  int nc;
  vector<int,_std::allocator<int>_> *cmap;
  Graph *cgraph;
  vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_> *components;
  cmComputeComponentGraph *ccg_local;
  cmComputeTargetDepends *this_local;
  
  this_00 = cmComputeComponentGraph::GetComponents(ccg);
  this_01 = &cmComputeComponentGraph::GetComponentGraph(ccg)->
             super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>;
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&(this->FinalGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,0);
  sVar4 = std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::size
                    (&(this->InitialGraph).
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>);
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&(this->FinalGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
             sVar4);
  cmap_00 = cmComputeComponentGraph::GetComponentMap(ccg);
  sVar4 = std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::size(this_00);
  std::vector<int,_std::allocator<int>_>::resize(&this->ComponentHead,sVar4);
  sVar4 = std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::size(this_00);
  std::vector<int,_std::allocator<int>_>::resize(&this->ComponentTail,sVar4);
  sVar4 = std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::size(this_00);
  for (local_40 = 0; local_40 < (int)sVar4; local_40 = local_40 + 1) {
    emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = -1;
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&nl);
    __range2 = (cmRange<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
                *)std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::operator[]
                            (this_00,(long)local_40);
    cmReverseRange<cmGraphNodeList>(&local_98);
    local_98.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&local_98;
    cmRange<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::begin((cmRange<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
             *)&__end2);
    cmRange<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::end((cmRange<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
           *)local_b8);
    while (bVar3 = std::operator!=(&__end2,(reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                                            *)local_b8),
          vVar2 = emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_, bVar3) {
      piVar5 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator*(&__end2);
      visited._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = *piVar5;
      std::set<int,_std::less<int>,_std::allocator<int>_>::set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)&n);
      bVar3 = IntraComponent(this,cmap_00,local_40,
                             visited._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
                             (int *)((long)&emitted._M_t._M_impl.super__Rb_tree_header._M_node_count
                                    + 4),(set<int,_std::less<int>,_std::allocator<int>_> *)&nl,
                             (set<int,_std::less<int>,_std::allocator<int>_> *)&n);
      if (!bVar3) {
        ComplainAboutBadComponent(this,ccg,local_40,true);
        this_local._7_1_ = 0;
      }
      bVar3 = !bVar3;
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)&n);
      if (bVar3) goto LAB_005ed9a4;
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
      ::operator++(&__end2);
    }
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->ComponentHead,(long)local_40)
    ;
    *pvVar6 = vVar2;
    bVar3 = false;
LAB_005ed9a4:
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&nl);
    if (bVar3) goto LAB_005edb5d;
  }
  sVar4 = std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::size(this_01);
  for (nl_1._4_4_ = 0; nl_1._4_4_ < (int)sVar4; nl_1._4_4_ = nl_1._4_4_ + 1) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->ComponentTail,(long)nl_1._4_4_);
    iVar1 = *pvVar6;
    this_02 = &std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                         (this_01,(long)nl_1._4_4_)->
               super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
    __end2_1 = std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::begin(this_02);
    ni_1 = (cmGraphEdge *)std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::end(this_02);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                               *)&ni_1), bVar3) {
      _dependee_component_head =
           __gnu_cxx::
           __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
           ::operator*(&__end2_1);
      local_12c = cmGraphEdge::operator_cast_to_int(_dependee_component_head);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->ComponentHead,(long)local_12c);
      local_130 = *pvVar6;
      this_03 = (vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                          (&(this->FinalGraph).
                            super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                           (long)iVar1);
      local_131 = cmGraphEdge::IsStrong(_dependee_component_head);
      __args_2 = cmGraphEdge::GetBacktrace(_dependee_component_head);
      std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
      emplace_back<int&,bool,cmListFileBacktrace_const&>(this_03,&local_130,&local_131,__args_2);
      __gnu_cxx::
      __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
      ::operator++(&__end2_1);
    }
  }
  this_local._7_1_ = 1;
LAB_005edb5d:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmComputeTargetDepends::ComputeFinalDepends(
  cmComputeComponentGraph const& ccg)
{
  // Get the component graph information.
  std::vector<NodeList> const& components = ccg.GetComponents();
  Graph const& cgraph = ccg.GetComponentGraph();

  // Allocate the final graph.
  this->FinalGraph.resize(0);
  this->FinalGraph.resize(this->InitialGraph.size());

  // Choose intra-component edges to linearize dependencies.
  std::vector<int> const& cmap = ccg.GetComponentMap();
  this->ComponentHead.resize(components.size());
  this->ComponentTail.resize(components.size());
  int nc = static_cast<int>(components.size());
  for (int c = 0; c < nc; ++c) {
    int head = -1;
    std::set<int> emitted;
    NodeList const& nl = components[c];
    for (int ni : cmReverseRange(nl)) {
      std::set<int> visited;
      if (!this->IntraComponent(cmap, c, ni, &head, emitted, visited)) {
        // Cycle in add_dependencies within component!
        this->ComplainAboutBadComponent(ccg, c, true);
        return false;
      }
    }
    this->ComponentHead[c] = head;
  }

  // Convert inter-component edges to connect component tails to heads.
  int n = static_cast<int>(cgraph.size());
  for (int depender_component = 0; depender_component < n;
       ++depender_component) {
    int depender_component_tail = this->ComponentTail[depender_component];
    EdgeList const& nl = cgraph[depender_component];
    for (cmGraphEdge const& ni : nl) {
      int dependee_component = ni;
      int dependee_component_head = this->ComponentHead[dependee_component];
      this->FinalGraph[depender_component_tail].emplace_back(
        dependee_component_head, ni.IsStrong(), ni.GetBacktrace());
    }
  }
  return true;
}